

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_compressCCtx(ZSTDMT_CCtx *mtctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,
                          int compressionLevel)

{
  ZSTD_parameters params_00;
  size_t sVar1;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  int local_60;
  undefined1 local_5c [4];
  int overlapLog;
  ZSTD_parameters params;
  int compressionLevel_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTDMT_CCtx *mtctx_local;
  
  params.fParams.checksumFlag = compressionLevel;
  unique0x1000017b = srcSize;
  ZSTD_getParams((ZSTD_parameters *)local_5c,compressionLevel,srcSize,0);
  local_60 = ZSTDMT_overlapLog_default(params.cParams.minMatch);
  sVar1 = stack0xffffffffffffffd0;
  params.cParams.targetLength = 1;
  memcpy(&local_88,local_5c,0x28);
  params_00.cParams.hashLog = (undefined4)uStack_80;
  params_00.cParams.searchLog = uStack_80._4_4_;
  params_00.cParams.windowLog = (undefined4)local_88;
  params_00.cParams.chainLog = local_88._4_4_;
  params_00.cParams.minMatch = (undefined4)uStack_78;
  params_00.cParams.targetLength = uStack_78._4_4_;
  params_00.cParams.strategy = (undefined4)uStack_70;
  params_00.fParams.contentSizeFlag = uStack_70._4_4_;
  params_00.fParams.checksumFlag = (undefined4)local_68;
  params_00.fParams.noDictIDFlag = local_68._4_4_;
  sVar1 = ZSTDMT_compress_advanced
                    (mtctx,dst,dstCapacity,src,sVar1,(ZSTD_CDict *)0x0,params_00,local_60);
  return sVar1;
}

Assistant:

size_t ZSTDMT_compressCCtx(ZSTDMT_CCtx* mtctx,
                           void* dst, size_t dstCapacity,
                     const void* src, size_t srcSize,
                           int compressionLevel)
{
    ZSTD_parameters params = ZSTD_getParams(compressionLevel, srcSize, 0);
    int const overlapLog = ZSTDMT_overlapLog_default(params.cParams.strategy);
    params.fParams.contentSizeFlag = 1;
    return ZSTDMT_compress_advanced(mtctx, dst, dstCapacity, src, srcSize, NULL, params, overlapLog);
}